

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_image.c
# Opt level: O0

int jas_image_encode(jas_image_t *image,jas_stream_t *out,int fmt,char *optstr)

{
  jas_image_fmtinfo_t *pjVar1;
  int local_3c;
  jas_image_fmtinfo_t *fmtinfo;
  char *optstr_local;
  int fmt_local;
  jas_stream_t *out_local;
  jas_image_t *image_local;
  
  pjVar1 = jas_image_lookupfmtbyid(fmt);
  if (pjVar1 == (jas_image_fmtinfo_t *)0x0) {
    jas_eprintf("format lookup failed\n");
    image_local._4_4_ = -1;
  }
  else {
    if ((pjVar1->ops).encode == (_func_int_jas_image_t_ptr_jas_stream_t_ptr_char_ptr *)0x0) {
      local_3c = -1;
    }
    else {
      local_3c = (*(pjVar1->ops).encode)(image,out,optstr);
    }
    image_local._4_4_ = local_3c;
  }
  return image_local._4_4_;
}

Assistant:

int jas_image_encode(jas_image_t *image, jas_stream_t *out, int fmt,
  const char *optstr)
{
	const jas_image_fmtinfo_t *fmtinfo;
	if (!(fmtinfo = jas_image_lookupfmtbyid(fmt))) {
		jas_eprintf("format lookup failed\n");
		return -1;
	}
	return (fmtinfo->ops.encode) ? (*fmtinfo->ops.encode)(image, out,
	  optstr) : (-1);
}